

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::strconv_comment(char_t *s,char_t endch)

{
  char_t *pcVar1;
  int iVar2;
  byte *pbVar3;
  undefined1 local_30 [7];
  char_t ss;
  gap g;
  byte *pbStack_18;
  char_t endch_local;
  char_t *s_local;
  
  g.size._7_1_ = endch;
  pbStack_18 = (byte *)s;
  gap::gap((gap *)local_30);
  do {
    while (((anonymous_namespace)::chartype_table[*pbStack_18] & 0x20) != 0) {
LAB_0015a527:
      if (*pbStack_18 == 0xd) {
        pbVar3 = pbStack_18 + 1;
        *pbStack_18 = 10;
        pbStack_18 = pbVar3;
        if (*pbVar3 == 10) {
          gap::push((gap *)local_30,(char_t **)&stack0xffffffffffffffe8,1);
        }
      }
      else {
        if (((*pbStack_18 == 0x2d) && (pbStack_18[1] == 0x2d)) &&
           ((pbStack_18[2] == 0x3e || ((pbStack_18[2] == 0 && (g.size._7_1_ == '>')))))) {
          pcVar1 = gap::flush((gap *)local_30,(char_t *)pbStack_18);
          *pcVar1 = '\0';
          iVar2 = 2;
          if (pbStack_18[2] == 0x3e) {
            iVar2 = 3;
          }
          return (char_t *)(pbStack_18 + iVar2);
        }
        if (*pbStack_18 == 0) {
          return (char_t *)0x0;
        }
        pbStack_18 = pbStack_18 + 1;
      }
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[1]] & 0x20) != 0) {
      pbStack_18 = pbStack_18 + 1;
      goto LAB_0015a527;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[2]] & 0x20) != 0) {
      pbStack_18 = pbStack_18 + 2;
      goto LAB_0015a527;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[3]] & 0x20) != 0) {
      pbStack_18 = pbStack_18 + 3;
      goto LAB_0015a527;
    }
    pbStack_18 = pbStack_18 + 4;
  } while( true );
}

Assistant:

PUGI__FN char_t* strconv_comment(char_t* s, char_t endch)
	{
		gap g;

		while (true)
		{
			PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_comment));

			if (*s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
			{
				*s++ = '\n'; // replace first one with 0x0a

				if (*s == '\n') g.push(s, 1);
			}
			else if (s[0] == '-' && s[1] == '-' && PUGI__ENDSWITH(s[2], '>')) // comment ends here
			{
				*g.flush(s) = 0;

				return s + (s[2] == '>' ? 3 : 2);
			}
			else if (*s == 0)
			{
				return 0;
			}
			else ++s;
		}
	}